

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

Gia_Man_t * Gia_ManDupUnshuffleInputs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  
  iVar6 = Gia_ManIsNormalized(p);
  if (iVar6 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  if (((p->nRegs < 1) || ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0)) ||
     (iVar6 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar6 < 1)) {
    __assert_fail("Gia_ManIsSeqWithBoxes(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd2,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  iVar6 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  iVar7 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
  if (iVar7 != p->vCis->nSize) {
    __assert_fail("nAll == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xde,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  uVar12 = iVar6 - p->nRegs;
  if ((int)uVar12 < 1) {
    __assert_fail("nPis > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xdf,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  uVar14 = (ulong)uVar12;
  uVar15 = 0;
  do {
    pGVar10 = Gia_ManAppendObj(p_00);
    uVar4 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
    *(ulong *)pGVar10 =
         uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar5 = p_00->pObjs;
    if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00232279;
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
    pGVar5 = p_00->pObjs;
    if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00232279;
    if ((long)p->vCis->nSize <= (long)uVar15) goto LAB_002322b7;
    iVar6 = p->vCis->pArray[uVar15];
    if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00232298;
    p->pObjs[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
    uVar15 = uVar15 + 1;
  } while (uVar14 != uVar15);
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    uVar15 = (ulong)(uint)(iVar7 - iVar6);
    do {
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00232279;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00232279;
      if ((iVar7 - iVar6 < 0) || (p->vCis->nSize <= (int)uVar15)) goto LAB_002322b7;
      iVar1 = p->vCis->pArray[uVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00232298;
      p->pObjs[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 < iVar7);
    iVar6 = p->nRegs;
  }
  if ((int)uVar12 < iVar7 - iVar6) {
    do {
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00232279:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00232279;
      if (p->vCis->nSize <= (int)uVar14) {
LAB_002322b7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = p->vCis->pArray[uVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00232298;
      p->pObjs[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < iVar7 - p->nRegs);
  }
  puts("Warning: Unshuffled CI order to be correct AIG with boxes.");
  iVar6 = p->nObjs;
  if (0 < iVar6) {
    lVar16 = 8;
    lVar13 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)((long)pGVar5 + lVar16 + -8);
      if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
        uVar12 = *(uint *)((long)pGVar5 +
                          lVar16 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar2 = *(uint *)((long)pGVar5 +
                             lVar16 + (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_002322d6;
        iVar6 = Gia_ManAppendAnd(p_00,uVar12 ^ (uint)(uVar14 >> 0x1d) & 1,
                                 uVar2 ^ (uint)(uVar14 >> 0x3d) & 1);
        *(int *)(&pGVar5->field_0x0 + lVar16) = iVar6;
        iVar6 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar13 < iVar6);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar13];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_00232298:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar6;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_002322d6:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                    pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value
                              );
      pGVar5->Value = uVar12;
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCos;
    } while (lVar13 < pVVar11->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  iVar6 = Gia_ManIsNormalized(p_00);
  if (iVar6 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xf1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManDupRemapEquiv(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupUnshuffleInputs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nCIs, nAll, nPis;
    // sanity checks
    assert( Gia_ManIsNormalized(p) );
    assert( Gia_ManIsSeqWithBoxes(p) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    // change input order
    // desired reorder:   PIs + NewCIs + FOs
    // current CI order:  PIs + FOs + NewCIs
    nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
    nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
    nPis = nCIs - Gia_ManRegNum(p);
    assert( nAll == Gia_ManCiNum(p) );
    assert( nPis > 0 );
    // copy PIs first
    for ( i = 0; i < nPis; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy flops second
    for ( i = nAll - Gia_ManRegNum(p); i < nAll; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy new CIs last
    for ( i = nPis; i < nAll - Gia_ManRegNum(p); i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    printf( "Warning: Unshuffled CI order to be correct AIG with boxes.\n" );
    // other things
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}